

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::AcesInputFile::AcesInputFile(AcesInputFile *this,string *name,int numThreads)

{
  void *pvVar1;
  undefined8 in_RSI;
  char *in_RDI;
  RgbaInputFile *unaff_retaddr;
  Data *in_stack_000002a0;
  int numThreads_00;
  char *name_00;
  
  numThreads_00 = (int)((ulong)in_RSI >> 0x20);
  *(undefined ***)in_RDI = &PTR__AcesInputFile_00562878;
  name_00 = in_RDI;
  pvVar1 = operator_new(0x70);
  Data::Data((Data *)0x2c5e3d);
  *(void **)(in_RDI + 8) = pvVar1;
  pvVar1 = operator_new(0x38);
  std::__cxx11::string::c_str();
  RgbaInputFile::RgbaInputFile(unaff_retaddr,name_00,numThreads_00);
  **(undefined8 **)(in_RDI + 8) = pvVar1;
  Data::initColorConversion(in_stack_000002a0);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (const std::string &name, int numThreads):
    _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (name.c_str(), numThreads);
    _data->initColorConversion();
}